

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenUtils.hpp
# Opt level: O1

Index pgi::detail::sample_from_pmf<Eigen::SparseVector<double,0,int>>
                (SparseMatrixBase<Eigen::SparseVector<double,_0,_int>_> *pmf,Scalar *random01)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Index IVar4;
  runtime_error *this;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  if (0 < *(long *)(pmf + 0x28)) {
    lVar1 = *(long *)(pmf + 0x18);
    dVar8 = 0.0;
    IVar4 = 0;
    do {
      dVar9 = 0.0;
      if (lVar1 != 0) {
        iVar3 = (int)IVar4;
        lVar2 = *(long *)(pmf + 0x10);
        lVar6 = lVar1 + -1;
        if (iVar3 != *(int *)(lVar2 + -4 + lVar1 * 4)) {
          lVar6 = 0;
          lVar7 = lVar1 + -1;
          if (1 < lVar1) {
            do {
              lVar5 = lVar7 + lVar6 >> 1;
              if (*(int *)(lVar2 + lVar5 * 4) < iVar3) {
                lVar6 = lVar5 + 1;
                lVar5 = lVar7;
              }
              lVar7 = lVar5;
            } while (lVar6 < lVar5);
          }
          dVar9 = 0.0;
          if ((lVar1 <= lVar6) || (iVar3 != *(int *)(lVar2 + lVar6 * 4))) goto LAB_0016af7a;
        }
        dVar9 = *(double *)(*(long *)(pmf + 8) + lVar6 * 8);
      }
LAB_0016af7a:
      dVar8 = dVar8 + dVar9;
      if (*random01 <= dVar8) {
        return IVar4;
      }
      IVar4 = IVar4 + 1;
    } while (IVar4 != *(long *)(pmf + 0x28));
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"failed sampling!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename Eigen::SparseMatrixBase<Derived>::Index sample_from_pmf(
    const Eigen::SparseMatrixBase<Derived>& pmf,
    const typename Derived::Scalar& random01) {
  typename Derived::Scalar cumulative(0);
  const Derived& mat(pmf.derived());
  for (typename Eigen::SparseMatrixBase<Derived>::Index i = 0; i < pmf.size();
       ++i) {
    cumulative += mat.coeff(i);
    if (cumulative >= random01) return i;
  }
  throw std::runtime_error("failed sampling!");
}